

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_endpoint_refiner.cpp
# Opt level: O3

void __thiscall
crnlib::dxt_endpoint_refiner::optimize_dxt1
          (dxt_endpoint_refiner *this,vec3F *low_color,vec3F *high_color)

{
  void *pvVar1;
  byte bVar2;
  params *ppVar3;
  uint8 *puVar4;
  results *prVar5;
  uint uVar6;
  void *pvVar7;
  uint uVar8;
  ulong uVar9;
  color_quad_u8 *pcVar10;
  ushort uVar11;
  int iVar12;
  undefined1 *puVar13;
  short sVar14;
  ulong uVar15;
  undefined1 *puVar16;
  ushort uVar17;
  uint uVar19;
  int iVar20;
  int iVar21;
  uint64 s;
  long lVar22;
  ushort uVar23;
  long lVar24;
  uint c;
  uint uVar25;
  uint uVar26;
  long lVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint i;
  ulong uVar33;
  bool bVar34;
  uint uVar35;
  uint uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  uint uVar42;
  uint uVar45;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  uint iterations;
  vector<unsigned_int> solutions;
  uint64 hist [4];
  uint64 d [3];
  color_quad_u8 block_colors [4];
  uint64 DD [4] [3];
  uint64 D2 [4] [3];
  ushort local_1c4;
  ushort local_1c0;
  uint local_1b0;
  int local_190;
  elemental_vector local_188;
  dxt_endpoint_refiner *local_170;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  ulong local_148;
  ulong local_140;
  long local_138 [4];
  undefined1 local_118 [16];
  color_quad_u8 local_108 [4];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  short sVar18;
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  
  uVar35 = (uint)(low_color->m_s[1] * 64.0);
  uVar36 = (uint)(high_color->m_s[0] * 32.0);
  uVar42 = -(uint)((int)uVar35 < 0x3f);
  uVar45 = -(uint)((int)uVar36 < 0x1f);
  uVar42 = ~uVar42 & 0x3f | uVar35 & uVar42;
  uVar35 = ~uVar45 & 0x1f | uVar36 & uVar45;
  uVar35 = -(uint)(0 < (int)uVar35) & uVar35;
  auVar40._0_4_ = (-(uint)(0 < (int)uVar42) & uVar42) << 5;
  auVar41._4_4_ = uVar35 << 5;
  auVar41._0_4_ = auVar40._0_4_;
  auVar41._8_4_ = auVar41._4_4_;
  auVar41._12_4_ = uVar35 << 0xb;
  auVar40._8_8_ = auVar41._8_8_;
  auVar40._4_4_ = uVar35 << 0xb;
  uVar35 = (uint)(low_color->m_s[0] * 32.0);
  uVar36 = (uint)(high_color->m_s[1] * 64.0);
  uVar42 = -(uint)((int)uVar35 < 0x1f);
  uVar45 = -(uint)((int)uVar36 < 0x3f);
  uVar42 = ~uVar42 & 0x1f | uVar35 & uVar42;
  uVar35 = ~uVar45 & 0x3f | uVar36 & uVar45;
  uVar35 = -(uint)(0 < (int)uVar35) & uVar35;
  auVar38._0_4_ = (-(uint)(0 < (int)uVar42) & uVar42) << 0xb;
  auVar39._4_4_ = uVar35 << 0xb;
  auVar39._0_4_ = auVar38._0_4_;
  auVar39._8_4_ = auVar39._4_4_;
  auVar39._12_4_ = uVar35 << 5;
  auVar38._8_8_ = auVar39._8_8_;
  auVar38._4_4_ = uVar35 << 5;
  auVar44._0_4_ = (int)(low_color->m_s[2] * 32.0);
  auVar44._4_4_ = (int)(high_color->m_s[2] * 32.0);
  auVar44._8_8_ = 0;
  auVar43._0_4_ = -(uint)(auVar44._0_4_ < (int)DAT_001b0440);
  auVar43._4_4_ = -(uint)(auVar44._4_4_ < DAT_001b0440._4_4_);
  auVar43._8_4_ = -(uint)(0 < DAT_001b0440._8_4_);
  auVar43._12_4_ = -(uint)(0 < DAT_001b0440._12_4_);
  auVar44 = ~auVar43 & _DAT_001b0440 | auVar44 & auVar43;
  auVar37._0_4_ = -(uint)(0 < auVar44._0_4_);
  auVar37._4_4_ = -(uint)(0 < auVar44._4_4_);
  auVar37._8_4_ = -(uint)(0 < auVar44._8_4_);
  auVar37._12_4_ = -(uint)(0 < auVar44._12_4_);
  auVar44 = auVar37 & auVar44 | auVar38 | auVar40;
  local_158 = (undefined1  [16])0x0;
  local_168 = (undefined1  [16])0x0;
  local_48 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_b8 = (undefined1  [16])0x0;
  local_c8 = (undefined1  [16])0x0;
  local_d8 = (undefined1  [16])0x0;
  local_e8 = (undefined1  [16])0x0;
  local_f8 = (undefined1  [16])0x0;
  ppVar3 = this->m_pParams;
  uVar35 = ppVar3->m_num_pixels;
  if ((ulong)uVar35 == 0) {
    local_158._8_8_ = 0;
    local_168._8_8_ = 0;
    local_158._0_8_ = 0;
    local_168._0_8_ = 0;
  }
  else {
    pcVar10 = ppVar3->m_pPixels;
    puVar4 = ppVar3->m_pSelectors;
    uVar15 = 0;
    do {
      bVar2 = puVar4[uVar15];
      *(long *)(local_168 + (ulong)bVar2 * 8) = *(long *)(local_168 + (ulong)bVar2 * 8) + 1;
      lVar22 = (ulong)bVar2 * 0x18;
      lVar24 = 0;
      do {
        bVar2 = (pcVar10->field_0).c[lVar24];
        *(ulong *)(local_98 + lVar24 * 8 + lVar22) =
             *(long *)(local_98 + lVar24 * 8 + lVar22) + (ulong)((uint)bVar2 * 2);
        *(ulong *)(local_f8 + lVar24 * 8 + lVar22) =
             *(long *)(local_f8 + lVar24 * 8 + lVar22) + (ulong)bVar2 * (ulong)bVar2;
        lVar24 = lVar24 + 1;
      } while (lVar24 != 3);
      uVar15 = uVar15 + 1;
      pcVar10 = pcVar10 + 1;
    } while (uVar15 != uVar35);
  }
  local_140 = local_158._8_8_ + local_168._8_8_;
  local_148 = local_158._0_8_ + local_168._0_8_;
  local_118 = pshuflw(auVar44,auVar44,0xe8);
  local_188.m_p = (void *)0x0;
  local_188.m_size = 0;
  local_188.m_capacity = 0;
  local_170 = this;
  elemental_vector::increase_capacity(&local_188,0x36,false,4,(object_mover)0x0,false);
  memset((void *)((ulong)local_188.m_size * 4 + (long)local_188.m_p),0,
         (ulong)(0x36 - local_188.m_size) << 2);
  local_188.m_size = 0x36;
  local_190 = 8;
  do {
    local_1b0 = local_118._0_4_ & 0xffff;
    uVar35 = local_118._0_4_ & 0x1f;
    uVar15 = 0;
    sVar14 = (short)uVar35;
    uVar23 = sVar14 - 1;
    if (sVar14 == 0) {
      uVar23 = 0;
    }
    uVar11 = local_118._2_2_;
    uVar36 = (uint)uVar11;
    pvVar7 = local_188.m_p;
    if (uVar23 <= (ushort)(sVar14 + 1U)) {
      uVar45 = local_1b0 >> 5 & 0x3f;
      uVar15 = 0;
      sVar14 = (short)uVar45;
      uVar42 = (uint)(ushort)(sVar14 - 1);
      if (sVar14 == 0) {
        uVar42 = 0;
      }
      sVar18 = (short)(local_1b0 >> 0xb);
      uVar17 = sVar18 + -1 + (ushort)(local_1b0 < 0x800);
      uVar25 = ((uint)uVar11 * 0x10000 + (uint)uVar17 * 0x800 | uVar42 << 5) + (uint)uVar23;
      uVar31 = (uVar42 << 5 | (uint)uVar17 * 0x800) + (uint)uVar23;
      iVar20 = local_1b0 - uVar31;
      uVar30 = (uint)uVar23;
      do {
        local_1c4 = (ushort)uVar42;
        uVar32 = uVar31;
        iVar21 = iVar20;
        uVar29 = uVar42;
        uVar26 = uVar25;
        if (local_1c4 <= (ushort)(sVar14 + 1U)) {
          do {
            uVar33 = uVar15;
            uVar19 = (uint)uVar17;
            iVar12 = iVar21;
            uVar6 = uVar32;
            uVar8 = uVar26;
            if (uVar17 < 0x20 && uVar17 <= (ushort)(sVar18 + 1U)) {
              do {
                uVar15 = uVar33;
                if (iVar12 != 0) {
                  uVar28 = uVar8 << 0x10 | uVar8 >> 0x10;
                  if (uVar11 <= uVar6 && uVar6 != uVar36) {
                    uVar28 = uVar8;
                  }
                  uVar15 = (ulong)((int)uVar33 + 1);
                  *(uint *)((long)local_188.m_p + uVar33 * 4) = uVar28;
                }
                if (local_1b0 >> 0xb < uVar19) break;
                bVar34 = uVar19 < 0x1f;
                uVar33 = uVar15;
                uVar19 = uVar19 + 1;
                iVar12 = iVar12 + -0x800;
                uVar6 = uVar6 + 0x800;
                uVar8 = uVar8 + 0x800;
              } while (bVar34);
            }
            if (uVar45 < uVar29) break;
            uVar26 = uVar26 + 0x20;
            iVar21 = iVar21 + -0x20;
            uVar32 = uVar32 + 0x20;
            bVar34 = uVar29 < 0x3f;
            uVar29 = uVar29 + 1;
          } while (bVar34);
        }
        if (uVar35 < uVar30) break;
        uVar25 = uVar25 + 1;
        iVar20 = iVar20 + -1;
        uVar31 = uVar31 + 1;
        bVar34 = uVar30 < 0x1f;
        uVar30 = uVar30 + 1;
      } while (bVar34);
    }
    sVar14 = (short)(uVar36 & 0x1f);
    uVar35 = (uint)(ushort)(sVar14 - 1);
    if (sVar14 == 0) {
      uVar35 = 0;
    }
    if ((ushort)uVar35 <= (ushort)(sVar14 + 1U)) {
      uVar23 = uVar11 >> 0xb;
      uVar42 = uVar11 >> 5 & 0x3f;
      sVar14 = (short)uVar42;
      uVar45 = (uint)(ushort)(sVar14 - 1);
      if (sVar14 == 0) {
        uVar45 = 0;
      }
      uVar11 = (uVar23 - 1) + (ushort)(uVar36 < 0x800);
      uVar30 = (local_1b0 * 0x10000 + (uint)uVar11 * 0x800 | uVar45 << 5) + uVar35;
      uVar25 = (uVar45 << 5 | (uint)uVar11 * 0x800) + uVar35;
      iVar20 = uVar36 - uVar25;
      do {
        local_1c0 = (ushort)uVar45;
        uVar31 = uVar30;
        uVar32 = uVar25;
        uVar29 = uVar45;
        iVar21 = iVar20;
        if (local_1c0 <= (ushort)(sVar14 + 1U)) {
          do {
            uVar33 = uVar15;
            uVar19 = (uint)uVar11;
            uVar26 = uVar31;
            uVar6 = uVar32;
            iVar12 = iVar21;
            if (uVar11 < 0x20 && uVar11 <= (ushort)(uVar23 + 1)) {
              do {
                uVar15 = uVar33;
                if (iVar12 != 0) {
                  uVar8 = uVar26 << 0x10 | uVar26 >> 0x10;
                  if (local_1b0 < uVar6) {
                    uVar8 = uVar26;
                  }
                  uVar15 = (ulong)((int)uVar33 + 1);
                  *(uint *)((long)local_188.m_p + uVar33 * 4) = uVar8;
                }
                if (uVar23 < uVar19) break;
                bVar34 = uVar19 < 0x1f;
                uVar33 = uVar15;
                uVar19 = uVar19 + 1;
                uVar26 = uVar26 + 0x800;
                uVar6 = uVar6 + 0x800;
                iVar12 = iVar12 + -0x800;
              } while (bVar34);
            }
            if (uVar42 < uVar29) break;
            uVar31 = uVar31 + 0x20;
            iVar21 = iVar21 + -0x20;
            uVar32 = uVar32 + 0x20;
            bVar34 = uVar29 < 0x3f;
            uVar29 = uVar29 + 1;
          } while (bVar34);
        }
        if ((uVar36 & 0x1f) < uVar35) break;
        uVar30 = uVar30 + 1;
        iVar20 = iVar20 + -1;
        uVar25 = uVar25 + 1;
        bVar34 = uVar35 < 0x1f;
        uVar35 = uVar35 + 1;
      } while (bVar34);
    }
    if ((int)uVar15 == 0) goto LAB_001a3edd;
    pvVar1 = (void *)((long)local_188.m_p + uVar15 * 4);
    lVar22 = 0x3f;
    if (uVar15 != 0) {
      for (; uVar15 >> lVar22 == 0; lVar22 = lVar22 + -1) {
      }
    }
    std::__introsort_loop<unsigned_int*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_188.m_p,pvVar1,((uint)lVar22 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>(pvVar7,pvVar1);
    uVar33 = 0;
    bVar2 = 0;
    do {
      if (uVar33 == 0) {
        uVar35 = *local_188.m_p;
LAB_001a3d30:
        uVar23 = (ushort)(uVar35 >> 0x10);
        if ((uVar35 & 0xffff) == uVar35 >> 0x10) {
          if (local_140 < local_148) {
            uVar36 = (uint)((short)uVar35 == 0);
            sVar14 = -1;
            if (((uVar35 & 0x1f0000) == 0) && (sVar14 = -0x800, uVar35 < 0x8000000)) {
              sVar14 = (ushort)(uVar35 < 0x10000) * 0x20 + -0x20;
            }
          }
          else {
            uVar42 = ~uVar35;
            uVar36 = 1;
            if (((uVar42 & 0x1f) == 0) && (uVar36 = 0x800, (uVar42 & 0xf800) == 0)) {
              uVar36 = (uint)((uVar42 & 0x7e0) != 0) << 5;
            }
            sVar14 = -(ushort)(uVar35 >> 0x10 == 0xffff);
          }
          uVar35 = uVar36 + uVar35;
          uVar23 = uVar23 + sVar14;
        }
        pcVar10 = local_108;
        dxt1_block::get_block_colors4(pcVar10,(uint16)uVar35,uVar23);
        bVar34 = local_170->m_pParams->m_perceptual;
        puVar13 = local_98;
        puVar16 = local_f8;
        lVar22 = 0;
        uVar9 = 0;
        do {
          lVar24 = *(long *)(local_168 + lVar22 * 8);
          lVar27 = 0;
          do {
            local_138[lVar27] =
                 (lVar24 * (ulong)(pcVar10->field_0).c[lVar27] - *(long *)(puVar13 + lVar27 * 8)) *
                 (ulong)(pcVar10->field_0).c[lVar27] + *(long *)(puVar16 + lVar27 * 8);
            lVar27 = lVar27 + 1;
          } while (lVar27 != 3);
          if (bVar34 == false) {
            lVar24 = local_138[0] + local_138[1];
          }
          else {
            lVar24 = local_138[1] * 0x19 + local_138[0] * 8;
          }
          uVar9 = uVar9 + lVar24 + local_138[2];
          lVar22 = lVar22 + 1;
          pcVar10 = pcVar10 + 1;
          puVar16 = puVar16 + 0x18;
          puVar13 = puVar13 + 0x18;
        } while (lVar22 != 4);
        prVar5 = local_170->m_pResults;
        if (uVar9 < prVar5->m_error) {
          prVar5->m_low_color = (uint16)uVar35;
          prVar5->m_high_color = uVar23;
          prVar5->m_error = uVar9;
          if (uVar9 == 0) goto LAB_001a3ed8;
          local_118._8_8_ = 0;
          local_118._0_8_ = (ulong)uVar35 & 0xffffffff0000ffff | (ulong)uVar23 << 0x10;
          bVar2 = 1;
        }
      }
      else {
        uVar35 = *(uint *)((long)local_188.m_p + uVar33 * 4);
        if (uVar35 != *(uint *)((long)local_188.m_p + (uVar33 - 1) * 4)) goto LAB_001a3d30;
      }
      uVar33 = uVar33 + 1;
    } while (uVar33 != uVar15);
    local_190 = local_190 + -1;
  } while ((bool)(bVar2 & local_190 != 0));
LAB_001a3ed8:
LAB_001a3edd:
  if (local_188.m_p != (void *)0x0) {
    crnlib_free(local_188.m_p);
  }
  return;
}

Assistant:

void dxt_endpoint_refiner::optimize_dxt1(vec3F low_color, vec3F high_color)
    {
        uint16 L0 = math::clamp<int>(low_color[0] * 32.0f, 0, 31) << 11 | math::clamp<int>(low_color[1] * 64.0f, 0, 63) << 5 | math::clamp<int>(low_color[2] * 32.0f, 0, 31);
        uint16 H0 = math::clamp<int>(high_color[0] * 32.0f, 0, 31) << 11 | math::clamp<int>(high_color[1] * 64.0f, 0, 63) << 5 | math::clamp<int>(high_color[2] * 32.0f, 0, 31);

        uint64 hist[4] = {}, D2[4][3] = {}, DD[4][3] = {};
        for (uint i = 0; i < m_pParams->m_num_pixels; i++)
        {
            const color_quad_u8& pixel = m_pParams->m_pPixels[i];
            uint8 s = m_pParams->m_pSelectors[i];
            hist[s]++;
            for (uint c = 0; c < 3; c++)
            {
                D2[s][c] += pixel[c] * 2;
                DD[s][c] += pixel[c] * pixel[c];
            }
        }
        crnlib::vector<uint> solutions(54);
        bool preserveL = hist[0] + hist[2] > hist[1] + hist[3];
        bool improved = true;

        for (uint iterations = 8; improved && iterations; iterations--)
        {
            improved = false;
            uint solutions_count = 0;
            for (uint16 b0 = L0 & 31, g0 = L0 >> 5 & 63, r0 = L0 >> 11 & 31, b = b0 ? b0 - 1 : b0; b <= b0 + 1 && b <= 31; b++)
            {
                for (uint16 g = g0 ? g0 - 1 : g0; g <= g0 + 1 && g <= 63; g++)
                {
                    for (uint16 r = r0 ? r0 - 1 : r0; r <= r0 + 1 && r <= 31; r++)
                    {
                        uint16 L = r << 11 | g << 5 | b;
                        if (L != L0)
                        {
                            solutions[solutions_count++] = L > H0 ? L | H0 << 16 : H0 | L << 16;
                        }
                    }
                }
            }
            for (uint16 b0 = H0 & 31, g0 = H0 >> 5 & 63, r0 = H0 >> 11 & 31, b = b0 ? b0 - 1 : b0; b <= b0 + 1 && b <= 31; b++)
            {
                for (uint16 g = g0 ? g0 - 1 : g0; g <= g0 + 1 && g <= 63; g++)
                {
                    for (uint16 r = r0 ? r0 - 1 : r0; r <= r0 + 1 && r <= 31; r++)
                    {
                        uint16 H = r << 11 | g << 5 | b;
                        if (H != H0)
                        {
                            solutions[solutions_count++] = H > L0 ? H | L0 << 16 : L0 | H << 16;
                        }
                    }
                }
            }
            std::sort(solutions.begin(), solutions.begin() + solutions_count);
            for (uint i = 0; i < solutions_count; i++)
            {
                if (i && solutions[i] == solutions[i - 1])
                {
                    continue;
                }
                uint16 L = solutions[i] & 0xFFFF;
                uint16 H = solutions[i] >> 16;
                if (L == H)
                {
                    L += !preserveL ? ~L & 0x1F ? 0x1 : ~L & 0xF800 ? 0x800
                            : ~L & 0x7E0                            ? 0x20
                                                                    : 0
                        : !L        ? 0x1
                                    : 0;
                    H -= preserveL    ? H & 0x1F ? 0x1 : H & 0xF800 ? 0x800
                               : H & 0x7E0                          ? 0x20
                                                                    : 0
                        : H == 0xFFFF ? 0x1
                                      : 0;
                }
                color_quad_u8 block_colors[4];
                dxt1_block::get_block_colors4(block_colors, L, H);
                uint64 error = 0;
                for (uint64 s = 0, d[3]; s < 4; s++)
                {
                    for (uint c = 0; c < 3; c++)
                    {
                        d[c] = hist[s] * block_colors[s][c] * block_colors[s][c] - D2[s][c] * block_colors[s][c] + DD[s][c];
                    }
                    error += m_pParams->m_perceptual ? d[0] * 8 + d[1] * 25 + d[2] : d[0] + d[1] + d[2];
                }
                if (error < m_pResults->m_error)
                {
                    m_pResults->m_low_color = L0 = L;
                    m_pResults->m_high_color = H0 = H;
                    m_pResults->m_error = error;
                    if (!m_pResults->m_error)
                    {
                        return;
                    }
                    improved = true;
                }
            }
        }
    }